

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall
Clasp::ClaspFacade::Statistics::ClingoView::update(ClingoView *this,Statistics *stats)

{
  bool bVar1;
  ulong uVar2;
  StatsMap *pSVar3;
  StatsMap *pSVar4;
  StatisticObject local_20;
  
  if ((stats->level_ != 0) &&
     (pSVar4 = (StatsMap *)((this->accu_).ptr_ & 0xfffffffffffffffe), pSVar4 != (StatsMap *)0x0)) {
    pSVar3 = this->keys_;
    local_20 = StatisticObject::map<Clasp::StatsMap>(pSVar4);
    bVar1 = StatsMap::add(pSVar3,"accu",&local_20);
    if (bVar1) {
      pSVar4 = (StatsMap *)((this->accu_).ptr_ & 0xfffffffffffffffe);
      StepStats::addTo((StepStats *)(pSVar4 + 1),pSVar4);
      pSVar4 = (StatsMap *)((this->accu_).ptr_ & 0xfffffffffffffffe);
      local_20 = StatisticObject::map<Clasp::StatsMap>(pSVar4 + 3);
      StatsMap::add(pSVar4,"solving",&local_20);
    }
  }
  uVar2 = (this->accu_).ptr_ & 0xfffffffffffffffe;
  pSVar4 = (StatsMap *)(uVar2 + 0x30);
  if (uVar2 == 0) {
    pSVar4 = (StatsMap *)0x0;
  }
  pSVar3 = (StatsMap *)0x0;
  if (stats->level_ != 0) {
    pSVar3 = pSVar4;
  }
  addTo(stats,&this->solving_,pSVar3);
  if (stats->tester_ != (NonHcfStats *)0x0) {
    uVar2 = (this->accu_).ptr_ & 0xfffffffffffffffe;
    pSVar4 = (StatsMap *)(uVar2 + 0x30);
    if (uVar2 == 0) {
      pSVar4 = (StatsMap *)0x0;
    }
    pSVar3 = (StatsMap *)0x0;
    if (stats->level_ != 0) {
      pSVar3 = pSVar4;
    }
    Asp::PrgDepGraph::NonHcfStats::addTo(stats->tester_,&this->problem_,&this->solving_,pSVar3);
  }
  return;
}

Assistant:

void ClaspFacade::Statistics::ClingoView::update(const ClaspFacade::Statistics& stats) {
	if (stats.level_ > 0 && accu_.get() && keys_->add("accu", accu_->toStats())) {
		accu_->step.addTo(*accu_);
		accu_->add("solving", accu_->solving_.toStats());
	}
	stats.addTo(solving_, stats.level_ > 0 && accu_.get() ? &accu_->solving_ : 0);
	if (stats.tester_) {
		stats.tester_->addTo(problem_, solving_, stats.level_ > 0 && accu_.get() ? &accu_->solving_ : 0);
	}
}